

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderGetProgramiv2Test::iterate(GeometryShaderGetProgramiv2Test *this)

{
  bool bVar1;
  bool bVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  GLenum extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_3a0;
  undefined4 local_220;
  uint local_21c;
  GLint rv;
  GLenum pname;
  GLenum error_code;
  uint n_pname;
  char *local_90;
  char *specialized_dummy_vs_raw;
  string specialized_dummy_vs;
  char *specialized_dummy_fs_raw;
  string specialized_dummy_fs;
  GLenum GStack_28;
  bool result;
  uint n_pnames;
  GLenum pnames [4];
  Functions *gl;
  GeometryShaderGetProgramiv2Test *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  pnames[2] = (*pRVar5->_vptr_RenderContext[3])();
  pnames[3] = extraout_var;
  GStack_28 = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT;
  n_pnames = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE;
  pnames[0] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE;
  pnames[1] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS;
  bVar1 = true;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&specialized_dummy_fs_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
    specialized_dummy_vs.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&specialized_dummy_vs_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
    local_90 = (char *)std::__cxx11::string::c_str();
    GVar3 = (**(code **)(pnames._8_8_ + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    GVar3 = (**(code **)(pnames._8_8_ + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x28a);
    GVar3 = (**(code **)(pnames._8_8_ + 0x3c8))();
    this->m_po_id = GVar3;
    dVar4 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x28e);
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,
                       (char **)((long)&specialized_dummy_vs.field_2 + 8),this->m_vs_id,1,&local_90,
                       (bool *)0x0);
    if (bVar2) {
      for (pname = 0; pname < 4; pname = pname + 1) {
        rv = 0;
        local_21c = *(uint *)((long)&stack0xffffffffffffffd8 + (ulong)pname * 4);
        local_220 = 0xffffffff;
        (**(code **)(pnames._8_8_ + 0x9d8))(this->m_po_id,local_21c,&local_220);
        rv = (**(code **)(pnames._8_8_ + 0x800))();
        if (rv != 0x502) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_3a0,
                              (char (*) [51])"No error generated by glGetProgramiv() for pname [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_21c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x29ea7ce);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3a0);
          bVar1 = false;
        }
      }
    }
    else {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&error_code,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&error_code,
                          (char (*) [44])"Failed to build a dummy test program object");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&error_code);
      bVar1 = false;
    }
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    std::__cxx11::string::~string((string *)&specialized_dummy_vs_raw);
    std::__cxx11::string::~string((string *)&specialized_dummy_fs_raw);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
             ,0x27c);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramiv2Test::iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	const glw::GLenum pnames[] = { m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
								   m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
								   m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);
	bool			   result   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize the program object */
	std::string specialized_dummy_fs = specializeShader(1,
														/* parts */ &dummy_fs_code);
	const char* specialized_dummy_fs_raw = specialized_dummy_fs.c_str();
	std::string specialized_dummy_vs	 = specializeShader(1,
														/* parts */ &dummy_vs_code);
	const char* specialized_dummy_vs_raw = specialized_dummy_vs.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	if (!TestCaseBase::buildProgram(m_po_id, m_fs_id, 1, &specialized_dummy_fs_raw, m_vs_id, 1,
									&specialized_dummy_vs_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build a dummy test program object"
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Verify that GS-specific queries cause a GL_INVALID_OPERATION error
	 * for a linked PO lacking the GS stage.
	 */
	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLenum error_code = GL_NO_ERROR;
		glw::GLenum pname	  = pnames[n_pname];
		glw::GLint  rv		   = -1;

		gl.getProgramiv(m_po_id, pname, &rv);

		error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No error generated by glGetProgramiv() for pname [" << pname
							   << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all pnames) */

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}